

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

int stbi__jpeg_decode_block_prog_ac(stbi__jpeg *j,short *data,stbi__huffman *hac,stbi__int16 *fac)

{
  byte bVar1;
  undefined4 uVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  ushort *puVar6;
  byte bVar7;
  long in_RCX;
  long in_RSI;
  long in_RDI;
  short *p_1;
  int rs_1;
  int s_1;
  int r_1;
  short *p;
  short bit;
  int rs;
  int s;
  int r;
  int c;
  uint zig;
  int shift;
  int k;
  ushort *in_stack_ffffffffffffff98;
  int n;
  undefined4 in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  uint in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int local_2c;
  int local_4;
  
  if (*(int *)(in_RDI + 0x4734) == 0) {
    local_4 = stbi__err("can\'t merge dc and ac");
  }
  else {
    if (*(int *)(in_RDI + 0x473c) == 0) {
      uVar2 = *(undefined4 *)(in_RDI + 0x4740);
      if (*(int *)(in_RDI + 0x4744) != 0) {
        *(int *)(in_RDI + 0x4744) = *(int *)(in_RDI + 0x4744) + -1;
        return 1;
      }
      local_2c = *(int *)(in_RDI + 0x4734);
      do {
        if (*(int *)(in_RDI + 0x4724) < 0x10) {
          stbi__grow_buffer_unsafe
                    ((stbi__jpeg *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
        }
        uVar4 = (uint)*(short *)(in_RCX + (long)(int)(*(uint *)(in_RDI + 0x4720) >> 0x17) * 2);
        bVar7 = (byte)uVar2;
        if (uVar4 == 0) {
          uVar4 = stbi__jpeg_huff_decode
                            ((stbi__jpeg *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             (stbi__huffman *)
                             CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          if ((int)uVar4 < 0) {
            iVar5 = stbi__err("bad huffman code");
            return iVar5;
          }
          iVar5 = (int)uVar4 >> 4;
          n = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
          if ((uVar4 & 0xf) == 0) {
            if (iVar5 < 0xf) {
              *(int *)(in_RDI + 0x4744) = 1 << ((byte)iVar5 & 0x1f);
              if (iVar5 != 0) {
                iVar5 = stbi__jpeg_get_bits((stbi__jpeg *)
                                            CONCAT44(in_stack_ffffffffffffffa4,
                                                     in_stack_ffffffffffffffa0),n);
                *(int *)(in_RDI + 0x4744) = iVar5 + *(int *)(in_RDI + 0x4744);
              }
              *(int *)(in_RDI + 0x4744) = *(int *)(in_RDI + 0x4744) + -1;
              break;
            }
            local_2c = local_2c + 0x10;
          }
          else {
            iVar5 = iVar5 + local_2c;
            local_2c = iVar5 + 1;
            bVar1 = stbi__jpeg_dezigzag[iVar5];
            iVar5 = stbi__extend_receive
                              ((stbi__jpeg *)
                               CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),n);
            *(short *)(in_RSI + (ulong)bVar1 * 2) = (short)(iVar5 << (bVar7 & 0x1f));
          }
        }
        else {
          iVar5 = ((int)uVar4 >> 4 & 0xfU) + local_2c;
          *(int *)(in_RDI + 0x4720) = *(int *)(in_RDI + 0x4720) << (sbyte)(uVar4 & 0xf);
          *(uint *)(in_RDI + 0x4724) = *(int *)(in_RDI + 0x4724) - (uVar4 & 0xf);
          local_2c = iVar5 + 1;
          *(short *)(in_RSI + (ulong)stbi__jpeg_dezigzag[iVar5] * 2) =
               (short)(((int)uVar4 >> 8) << (bVar7 & 0x1f));
        }
      } while (local_2c <= *(int *)(in_RDI + 0x4738));
    }
    else {
      uVar3 = (ushort)(1 << ((byte)*(undefined4 *)(in_RDI + 0x4740) & 0x1f));
      if (*(int *)(in_RDI + 0x4744) == 0) {
        local_2c = *(int *)(in_RDI + 0x4734);
        do {
          in_stack_ffffffffffffffa4 =
               stbi__jpeg_huff_decode
                         ((stbi__jpeg *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                          (stbi__huffman *)
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
          if ((int)in_stack_ffffffffffffffa4 < 0) {
            iVar5 = stbi__err("bad huffman code");
            return iVar5;
          }
          in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa4 & 0xf;
          in_stack_ffffffffffffffac = (int)in_stack_ffffffffffffffa4 >> 4;
          if (in_stack_ffffffffffffffa8 == 0) {
            if (in_stack_ffffffffffffffac < 0xf) {
              *(int *)(in_RDI + 0x4744) = (1 << ((byte)in_stack_ffffffffffffffac & 0x1f)) + -1;
              if (in_stack_ffffffffffffffac != 0) {
                iVar5 = stbi__jpeg_get_bits((stbi__jpeg *)
                                            CONCAT44(in_stack_ffffffffffffffa4,
                                                     in_stack_ffffffffffffffa0),
                                            (int)((ulong)in_stack_ffffffffffffff98 >> 0x20));
                *(int *)(in_RDI + 0x4744) = iVar5 + *(int *)(in_RDI + 0x4744);
              }
              in_stack_ffffffffffffffac = 0x40;
            }
          }
          else {
            if (in_stack_ffffffffffffffa8 != 1) {
              iVar5 = stbi__err("bad huffman code");
              return iVar5;
            }
            iVar5 = stbi__jpeg_get_bit((stbi__jpeg *)
                                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                                      );
            if (iVar5 == 0) {
              in_stack_ffffffffffffffa8 = -(int)(short)uVar3;
            }
            else {
              in_stack_ffffffffffffffa8 = (uint)(short)uVar3;
            }
          }
          while (local_2c <= *(int *)(in_RDI + 0x4738)) {
            iVar5 = local_2c + 1;
            in_stack_ffffffffffffff98 =
                 (ushort *)(in_RSI + (ulong)stbi__jpeg_dezigzag[local_2c] * 2);
            local_2c = iVar5;
            if (*in_stack_ffffffffffffff98 == 0) {
              if (in_stack_ffffffffffffffac == 0) {
                *in_stack_ffffffffffffff98 = (ushort)in_stack_ffffffffffffffa8;
                break;
              }
              in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + -1;
            }
            else {
              iVar5 = stbi__jpeg_get_bit((stbi__jpeg *)
                                         CONCAT44(in_stack_ffffffffffffffa4,
                                                  in_stack_ffffffffffffffa0));
              if ((iVar5 != 0) && ((*in_stack_ffffffffffffff98 & uVar3) == 0)) {
                if ((short)*in_stack_ffffffffffffff98 < 1) {
                  *in_stack_ffffffffffffff98 = *in_stack_ffffffffffffff98 - uVar3;
                }
                else {
                  *in_stack_ffffffffffffff98 = *in_stack_ffffffffffffff98 + uVar3;
                }
              }
            }
          }
        } while (local_2c <= *(int *)(in_RDI + 0x4738));
      }
      else {
        *(int *)(in_RDI + 0x4744) = *(int *)(in_RDI + 0x4744) + -1;
        for (local_2c = *(int *)(in_RDI + 0x4734); local_2c <= *(int *)(in_RDI + 0x4738);
            local_2c = local_2c + 1) {
          puVar6 = (ushort *)(in_RSI + (ulong)stbi__jpeg_dezigzag[local_2c] * 2);
          if (((*puVar6 != 0) &&
              (iVar5 = stbi__jpeg_get_bit((stbi__jpeg *)
                                          CONCAT44(in_stack_ffffffffffffffa4,
                                                   in_stack_ffffffffffffffa0)), iVar5 != 0)) &&
             ((*puVar6 & uVar3) == 0)) {
            if ((short)*puVar6 < 1) {
              *puVar6 = *puVar6 - uVar3;
            }
            else {
              *puVar6 = *puVar6 + uVar3;
            }
          }
        }
      }
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

static int stbi__jpeg_decode_block_prog_ac(stbi__jpeg *j, short data[64], stbi__huffman *hac, stbi__int16 *fac)
{
   int k;
   if (j->spec_start == 0) return stbi__err("can't merge dc and ac", "Corrupt JPEG");

   if (j->succ_high == 0) {
      int shift = j->succ_low;

      if (j->eob_run) {
         --j->eob_run;
         return 1;
      }

      k = j->spec_start;
      do {
         unsigned int zig;
         int c,r,s;
         if (j->code_bits < 16) stbi__grow_buffer_unsafe(j);
         c = (j->code_buffer >> (32 - FAST_BITS)) & ((1 << FAST_BITS)-1);
         r = fac[c];
         if (r) { // fast-AC path
            k += (r >> 4) & 15; // run
            s = r & 15; // combined length
            j->code_buffer <<= s;
            j->code_bits -= s;
            zig = stbi__jpeg_dezigzag[k++];
            data[zig] = (short) ((r >> 8) << shift);
         } else {
            int rs = stbi__jpeg_huff_decode(j, hac);
            if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
            s = rs & 15;
            r = rs >> 4;
            if (s == 0) {
               if (r < 15) {
                  j->eob_run = (1 << r);
                  if (r)
                     j->eob_run += stbi__jpeg_get_bits(j, r);
                  --j->eob_run;
                  break;
               }
               k += 16;
            } else {
               k += r;
               zig = stbi__jpeg_dezigzag[k++];
               data[zig] = (short) (stbi__extend_receive(j,s) << shift);
            }
         }
      } while (k <= j->spec_end);
   } else {
      // refinement scan for these AC coefficients

      short bit = (short) (1 << j->succ_low);

      if (j->eob_run) {
         --j->eob_run;
         for (k = j->spec_start; k <= j->spec_end; ++k) {
            short *p = &data[stbi__jpeg_dezigzag[k]];
            if (*p != 0)
               if (stbi__jpeg_get_bit(j))
                  if ((*p & bit)==0) {
                     if (*p > 0)
                        *p += bit;
                     else
                        *p -= bit;
                  }
         }
      } else {
         k = j->spec_start;
         do {
            int r,s;
            int rs = stbi__jpeg_huff_decode(j, hac); // @OPTIMIZE see if we can use the fast path here, advance-by-r is so slow, eh
            if (rs < 0) return stbi__err("bad huffman code","Corrupt JPEG");
            s = rs & 15;
            r = rs >> 4;
            if (s == 0) {
               if (r < 15) {
                  j->eob_run = (1 << r) - 1;
                  if (r)
                     j->eob_run += stbi__jpeg_get_bits(j, r);
                  r = 64; // force end of block
               } else {
                  // r=15 s=0 should write 16 0s, so we just do
                  // a run of 15 0s and then write s (which is 0),
                  // so we don't have to do anything special here
               }
            } else {
               if (s != 1) return stbi__err("bad huffman code", "Corrupt JPEG");
               // sign bit
               if (stbi__jpeg_get_bit(j))
                  s = bit;
               else
                  s = -bit;
            }

            // advance by r
            while (k <= j->spec_end) {
               short *p = &data[stbi__jpeg_dezigzag[k++]];
               if (*p != 0) {
                  if (stbi__jpeg_get_bit(j))
                     if ((*p & bit)==0) {
                        if (*p > 0)
                           *p += bit;
                        else
                           *p -= bit;
                     }
               } else {
                  if (r == 0) {
                     *p = (short) s;
                     break;
                  }
                  --r;
               }
            }
         } while (k <= j->spec_end);
      }
   }
   return 1;
}